

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderWindow.cpp
# Opt level: O0

bool __thiscall sf::RenderWindow::setActive(RenderWindow *this,bool active)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte in_SIL;
  long in_RDI;
  bool result;
  bool in_stack_0000005f;
  RenderTarget *in_stack_00000060;
  char *in_stack_00000120;
  uint in_stack_0000012c;
  char *in_stack_00000130;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  bool local_1;
  
  bVar1 = in_SIL & 1;
  bVar2 = Window::setActive((Window *)
                            (CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffee,
                                                      in_stack_ffffffffffffffe8)) &
                            0x1ffffffffffffff),SUB81((ulong)in_RDI >> 0x38,0));
  if ((bool)bVar2) {
    RenderTarget::setActive(in_stack_00000060,in_stack_0000005f);
  }
  if ((((bVar1 & 1) == 0) || ((bVar2 & 1) == 0)) ||
     (bVar3 = priv::RenderTextureImplFBO::isAvailable(), !bVar3)) {
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    (*sf_ptrc_glBindFramebufferEXT)(0x8d40,*(GLuint *)(in_RDI + 0x210));
    priv::glCheckError(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool RenderWindow::setActive(bool active)
{
    bool result = Window::setActive(active);

    // Update RenderTarget tracking
    if (result)
        RenderTarget::setActive(active);

    // If FBOs are available, make sure none are bound when we
    // try to draw to the default framebuffer of the RenderWindow
    if (active && result && priv::RenderTextureImplFBO::isAvailable())
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, m_defaultFrameBuffer));

        return true;
    }

    return result;
}